

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_cmp_8_di(void)

{
  byte bVar1;
  uint uVar2;
  
  uVar2 = OPER_AY_DI_8();
  bVar1 = *(byte *)((long)m68ki_cpu.dar + (ulong)(m68ki_cpu.ir >> 7 & 0x1c));
  m68ki_cpu.n_flag = bVar1 - uVar2;
  m68ki_cpu.not_z_flag = m68ki_cpu.n_flag & 0xff;
  m68ki_cpu.v_flag = (bVar1 ^ m68ki_cpu.n_flag) & (uVar2 ^ bVar1);
  m68ki_cpu.c_flag = m68ki_cpu.n_flag;
  return;
}

Assistant:

static void m68k_op_cmp_8_di(void)
{
	uint src = OPER_AY_DI_8();
	uint dst = MASK_OUT_ABOVE_8(DX);
	uint res = dst - src;

	FLAG_N = NFLAG_8(res);
	FLAG_Z = MASK_OUT_ABOVE_8(res);
	FLAG_V = VFLAG_SUB_8(src, dst, res);
	FLAG_C = CFLAG_8(res);
}